

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O3

Float __thiscall pbrt::Image::BilerpChannel(Image *this,Point2f p,int c,WrapMode2D wrapMode)

{
  undefined8 unaff_RBX;
  long lVar1;
  Point2i p_00;
  Point2i p_01;
  undefined1 auVar2 [16];
  Float FVar3;
  Float FVar4;
  Float FVar5;
  undefined1 auVar6 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  float fVar9;
  undefined1 auVar10 [16];
  float fVar11;
  undefined1 extraout_var [60];
  
  auVar7._8_56_ = in_register_00001208;
  auVar7._0_8_ = p.super_Tuple2<pbrt::Point2,_float>;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar2._8_4_ = 0xbf000000;
  auVar2._0_8_ = 0xbf000000bf000000;
  auVar2._12_4_ = 0xbf000000;
  auVar2 = vfmadd213ps_avx512vl(auVar10,auVar7._0_16_,auVar2);
  auVar10 = vroundps_avx(auVar2,9);
  auVar6._0_4_ = (int)auVar10._0_4_;
  auVar6._4_4_ = (uint)auVar10._4_4_;
  auVar6._8_4_ = (int)auVar10._8_4_;
  auVar6._12_4_ = (int)auVar10._12_4_;
  auVar10 = vcvtdq2ps_avx(auVar6);
  lVar1 = CONCAT44((int)((ulong)unaff_RBX >> 0x20),auVar6._0_4_);
  FVar3 = GetChannel(this,(Point2i)(((ulong)auVar6._4_4_ << 0x20) + lVar1),c,wrapMode);
  p_00.super_Tuple2<pbrt::Point2,_int>.y = auVar6._4_4_;
  p_00.super_Tuple2<pbrt::Point2,_int>.x = auVar6._0_4_ + 1;
  FVar4 = GetChannel(this,p_00,c,wrapMode);
  FVar5 = GetChannel(this,(Point2i)(((ulong)(auVar6._4_4_ + 1) << 0x20) + lVar1),c,wrapMode);
  p_01.super_Tuple2<pbrt::Point2,_int>.y = auVar6._4_4_ + 1;
  p_01.super_Tuple2<pbrt::Point2,_int>.x = auVar6._0_4_ + 1;
  auVar8._0_4_ = GetChannel(this,p_01,c,wrapMode);
  auVar8._4_60_ = extraout_var;
  auVar2 = vsubps_avx(auVar2,auVar10);
  auVar10 = vmovshdup_avx(auVar2);
  fVar9 = auVar2._0_4_;
  fVar11 = auVar10._0_4_;
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * (1.0 - fVar11) * FVar4)),
                            ZEXT416((uint)((1.0 - fVar9) * (1.0 - fVar11))),ZEXT416((uint)FVar3));
  auVar10 = vfmadd132ss_fma(ZEXT416((uint)(fVar11 * (1.0 - fVar9))),auVar10,ZEXT416((uint)FVar5));
  auVar10 = vfmadd213ss_fma(auVar8._0_16_,ZEXT416((uint)(fVar9 * fVar11)),auVar10);
  return auVar10._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float BilerpChannel(Point2f p, int c, WrapMode2D wrapMode = WrapMode::Clamp) const {
        Float x = p[0] * resolution.x - 0.5f, y = p[1] * resolution.y - 0.5f;
        int xi = std::floor(x), yi = std::floor(y);
        Float dx = x - xi, dy = y - yi;
        pstd::array<Float, 4> v = {GetChannel({xi, yi}, c, wrapMode),
                                   GetChannel({xi + 1, yi}, c, wrapMode),
                                   GetChannel({xi, yi + 1}, c, wrapMode),
                                   GetChannel({xi + 1, yi + 1}, c, wrapMode)};
        return pbrt::Bilerp({dx, dy}, v);
    }